

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

PhysicalDeviceSelector * __thiscall
vkb::PhysicalDeviceSelector::add_required_extensions
          (PhysicalDeviceSelector *this,size_t count,char **extensions)

{
  size_t sVar1;
  allocator<char> local_59;
  PhysicalDeviceSelector *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = this;
  if (count != 0 && extensions != (char **)0x0) {
    sVar1 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,extensions[sVar1],&local_59);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(this->criteria).required_extensions,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      sVar1 = sVar1 + 1;
    } while (count != sVar1);
  }
  return local_58;
}

Assistant:

PhysicalDeviceSelector& PhysicalDeviceSelector::add_required_extensions(size_t count, const char* const* extensions) {
    if (!extensions || count == 0) return *this;
    for (size_t i = 0; i < count; i++) {
        criteria.required_extensions.push_back(extensions[i]);
    }
    return *this;
}